

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# moment_suite.cpp
# Opt level: O2

void mean_float_suite::test_linear_decrease(void)

{
  float *lhs;
  float local_38 [2];
  
  lhs = local_38 + 1;
  local_38[0] = 10.0;
  local_38[1] = 10.0;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,float,float>
            ("filter.mean()","10.0f",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]trial/test/decay/moment_suite.cpp"
             ,0x113,"void mean_float_suite::test_linear_decrease()",lhs,local_38);
  local_38[0] = 9.46667;
  local_38[1] = 9.466666;
  trial::online::detail::test_with_impl<float,trial::online::detail::close_to>
            ("filter.mean()","9.46667f","tolerance",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]trial/test/decay/moment_suite.cpp"
             ,0x115,"void mean_float_suite::test_linear_decrease()",lhs,local_38,
             (close_to<float>)0x8000003727c5ac);
  local_38[0] = 8.91124;
  local_38[1] = 8.9112425;
  trial::online::detail::test_with_impl<float,trial::online::detail::close_to>
            ("filter.mean()","8.91124f","tolerance",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]trial/test/decay/moment_suite.cpp"
             ,0x117,"void mean_float_suite::test_linear_decrease()",lhs,local_38,
             (close_to<float>)0x8000003727c5ac);
  local_38[0] = 8.33392;
  local_38[1] = 8.333923;
  trial::online::detail::test_with_impl<float,trial::online::detail::close_to>
            ("filter.mean()","8.33392f","tolerance",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]trial/test/decay/moment_suite.cpp"
             ,0x119,"void mean_float_suite::test_linear_decrease()",lhs,local_38,
             (close_to<float>)0x8000003727c5ac);
  local_38[0] = 7.47835;
  local_38[1] = 7.4783535;
  trial::online::detail::test_with_impl<float,trial::online::detail::close_to>
            ("filter.mean()","7.47835f","tolerance",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]trial/test/decay/moment_suite.cpp"
             ,0x11b,"void mean_float_suite::test_linear_decrease()",lhs,local_38,
             (close_to<float>)0x8000003727c5ac);
  local_38[0] = 7.1431;
  local_38[1] = 7.1430984;
  trial::online::detail::test_with_impl<float,trial::online::detail::close_to>
            ("filter.mean()","7.1431f","tolerance",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]trial/test/decay/moment_suite.cpp"
             ,0x11d,"void mean_float_suite::test_linear_decrease()",lhs,local_38,
             (close_to<float>)0x8000003727c5ac);
  local_38[0] = 6.49616;
  local_38[1] = 6.4961615;
  trial::online::detail::test_with_impl<float,trial::online::detail::close_to>
            ("filter.mean()","6.49616f","tolerance",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]trial/test/decay/moment_suite.cpp"
             ,0x11f,"void mean_float_suite::test_linear_decrease()",lhs,local_38,
             (close_to<float>)0x8000003727c5ac);
  local_38[0] = 5.83037;
  local_38[1] = 5.8303695;
  trial::online::detail::test_with_impl<float,trial::online::detail::close_to>
            ("filter.mean()","5.83037f","tolerance",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]trial/test/decay/moment_suite.cpp"
             ,0x121,"void mean_float_suite::test_linear_decrease()",lhs,local_38,
             (close_to<float>)0x8000003727c5ac);
  local_38[0] = 5.14573;
  local_38[1] = 5.1457314;
  trial::online::detail::test_with_impl<float,trial::online::detail::close_to>
            ("filter.mean()","5.14573f","tolerance",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]trial/test/decay/moment_suite.cpp"
             ,0x123,"void mean_float_suite::test_linear_decrease()",lhs,local_38,
             (close_to<float>)0x8000003727c5ac);
  local_38[0] = 4.44252;
  local_38[1] = 4.4425163;
  trial::online::detail::test_with_impl<float,trial::online::detail::close_to>
            ("filter.mean()","4.44252f","tolerance",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]trial/test/decay/moment_suite.cpp"
             ,0x125,"void mean_float_suite::test_linear_decrease()",lhs,local_38,
             (close_to<float>)0x8000003727c5ac);
  return;
}

Assistant:

void test_linear_decrease()
{
    const auto tolerance = detail::close_to<float>(1e-5f);
    decay::moment<float> filter(one_over_eight);
    filter.push(10.0f);
    TRIAL_TEST_EQ(filter.mean(), 10.0f);
    filter.push(9.0f);
    TRIAL_TEST_WITH(filter.mean(), 9.46667f, tolerance);
    filter.push(8.0f);
    TRIAL_TEST_WITH(filter.mean(), 8.91124f, tolerance);
    filter.push(7.0f);
    TRIAL_TEST_WITH(filter.mean(), 8.33392f, tolerance);
    filter.push(5.0f);
    TRIAL_TEST_WITH(filter.mean(), 7.47835f, tolerance);
    filter.push(6.0f);
    TRIAL_TEST_WITH(filter.mean(), 7.1431f, tolerance);
    filter.push(4.0f);
    TRIAL_TEST_WITH(filter.mean(), 6.49616f, tolerance);
    filter.push(3.0f);
    TRIAL_TEST_WITH(filter.mean(), 5.83037f, tolerance);
    filter.push(2.0f);
    TRIAL_TEST_WITH(filter.mean(), 5.14573f, tolerance);
    filter.push(1.0f);
    TRIAL_TEST_WITH(filter.mean(), 4.44252f, tolerance);
}